

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionTimingCheckArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionTimingCheckArgSyntax,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ExpressionTimingCheckArgSyntax *pEVar1;
  ExpressionSyntax *in_RDI;
  ExpressionTimingCheckArgSyntax *unaff_retaddr;
  
  pEVar1 = (ExpressionTimingCheckArgSyntax *)
           allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  slang::syntax::ExpressionTimingCheckArgSyntax::ExpressionTimingCheckArgSyntax
            (unaff_retaddr,in_RDI);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }